

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_disconnect(connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  smtp_conn *smtpc;
  _Bool dead_connection_local;
  connectdata *conn_local;
  
  if ((((!dead_connection) && ((conn->proto).ftpc.pp.conn != (connectdata *)0x0)) &&
      ((*(byte *)((conn->proto).sshc.readdir_len + 0x3a7) & 1) != 0)) &&
     (CVar1 = smtp_perform_quit(conn), CVar1 == CURLE_OK)) {
    smtp_block_statemach(conn,true);
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).ftpc.cwdcount);
  (*Curl_cfree)((conn->proto).ftpc.dirs);
  (conn->proto).ftpc.dirs = (char **)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The SMTP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && smtpc->pp.conn && smtpc->pp.conn->bits.protoconnstart)
    if(!smtp_perform_quit(conn))
      (void)smtp_block_statemach(conn, TRUE); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&smtpc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, smtpc->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(smtpc->domain);

  return CURLE_OK;
}